

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

string * __thiscall
Json::Value::toStyledString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  Value *in_RCX;
  char *__s;
  StreamWriterBuilder builder;
  string local_60;
  StreamWriterBuilder local_40;
  
  StreamWriterBuilder::StreamWriterBuilder(&local_40);
  if (this->comments_ == (CommentInfo *)0x0) {
    __s = "";
  }
  else {
    __s = "\n";
    if (this->comments_->comment_ == (char *)0x0) {
      __s = "";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_60);
  writeString_abi_cxx11_(&local_60,(Json *)&local_40,(Factory *)this,in_RCX);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  StreamWriterBuilder::~StreamWriterBuilder(&local_40);
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING Value::toStyledString() const {
  StreamWriterBuilder builder;

  JSONCPP_STRING out = this->hasComment(commentBefore) ? "\n" : "";
  out += Json::writeString(builder, *this);
  out += "\n";

  return out;
}